

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::powExpr(Parser *this)

{
  long lVar1;
  Report *this_00;
  Opcode op;
  LiteralType args;
  LiteralType args_2;
  _Head_base<0UL,_flow::lang::Expr_*,_false> this_01;
  long in_RSI;
  undefined8 uVar2;
  SourceLocation sloc;
  undefined1 local_a0 [8];
  _Head_base<0UL,_flow::lang::Expr_*,_false> local_98;
  undefined1 local_90 [32];
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_70;
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_68;
  _Any_data local_58;
  undefined8 local_48;
  _Invoker_type p_Stack_40;
  Report *local_38;
  
  lVar1 = *(long *)(in_RSI + 0x30);
  local_68._M_head_impl = (Lexer *)&local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,*(long *)(lVar1 + 0x68),
             *(long *)(lVar1 + 0x70) + *(long *)(lVar1 + 0x68));
  local_38 = *(Report **)(lVar1 + 0x98);
  local_48 = *(undefined8 *)(lVar1 + 0x88);
  p_Stack_40 = *(_Invoker_type *)(lVar1 + 0x90);
  negExpr((Parser *)local_a0);
  if ((_Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)local_a0 ==
      (Expr *)0x0) {
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  }
  else {
    uVar2 = *(undefined8 *)&(this->features_)._M_t._M_impl;
    do {
      if ((*(Lexer **)(in_RSI + 0x30))->token_ != Pow) {
        *(undefined1 (*) [8])&(this->features_)._M_t._M_impl = local_a0;
        goto LAB_001267b1;
      }
      Lexer::nextToken(*(Lexer **)(in_RSI + 0x30));
      powExpr((Parser *)&local_98);
      if (local_98._M_head_impl == (Expr *)0x0) {
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
        goto LAB_001267a1;
      }
      op = makeOperator(Pow,(Expr *)local_a0,local_98._M_head_impl);
      if (op == EXIT) {
        lVar1 = *(long *)(in_RSI + 0x30);
        this_00 = *(Report **)(in_RSI + 0x68);
        local_90._0_8_ = local_90 + 0x10;
        local_70._M_head_impl = (Lexer *)0x33;
        local_90._0_8_ = std::__cxx11::string::_M_create((ulong *)local_90,(ulong)&local_70);
        local_90._16_8_ = local_70._M_head_impl;
        *(undefined8 *)(local_90._0_8_ + 0x20) = 0x2073646e61726570;
        ((_Base_ptr)(local_90._0_8_ + 0x20))->_M_parent = (_Base_ptr)0x7b207d7b207d7b28;
        ((_Base_ptr)local_90._0_8_)->_M_left = (_Base_ptr)0x7270786520797261;
        ((_Base_ptr)local_90._0_8_)->_M_right = (_Base_ptr)0x6f206e6f69737365;
        ((_Base_ptr)local_90._0_8_)->_M_color = 0x6f636e49;
        ((_Base_ptr)local_90._0_8_)->field_0x4 = 'm';
        ((_Base_ptr)local_90._0_8_)->field_0x5 = 'p';
        ((_Base_ptr)local_90._0_8_)->field_0x6 = 'a';
        ((_Base_ptr)local_90._0_8_)->field_0x7 = 't';
        *(undefined4 *)&((_Base_ptr)local_90._0_8_)->_M_parent = 0x656c6269;
        builtin_strncpy((char *)((long)&((_Base_ptr)local_90._0_8_)->_M_parent + 4)," bin",4);
        *(undefined4 *)((long)&((_Base_ptr)(local_90._0_8_ + 0x20))->_M_parent + 7) = 0x2e297d7b;
        local_90._8_8_ = local_70._M_head_impl;
        *(undefined1 *)
         ((long)&(local_70._M_head_impl)->report_ + (long)&((_Base_ptr)local_90._0_8_)->_M_color) =
             0;
        args = (**(code **)(*(long *)local_a0 + 0x18))();
        args_2 = (*((local_98._M_head_impl)->super_ASTNode)._vptr_ASTNode[3])();
        diagnostics::Report::typeError<flow::LiteralType,flow::lang::Token,flow::LiteralType>
                  (this_00,(SourceLocation *)(lVar1 + 0x30),(string *)local_90,args,Pow,args_2);
        if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
        }
        uVar2 = 0;
        this_01._M_head_impl = (Expr *)local_a0;
      }
      else {
        this_01._M_head_impl = (Expr *)operator_new(0x58);
        BinaryExpr::BinaryExpr
                  ((BinaryExpr *)this_01._M_head_impl,op,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_a0,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_98
                  );
        if ((_Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)local_a0
            != (Expr *)0x0) {
          lVar1 = *(long *)local_a0;
          local_a0 = (undefined1  [8])this_01._M_head_impl;
          (**(code **)(lVar1 + 8))();
          this_01._M_head_impl = (Expr *)local_a0;
        }
      }
      local_a0 = (undefined1  [8])this_01._M_head_impl;
      if (local_98._M_head_impl != (Expr *)0x0) {
        (*((local_98._M_head_impl)->super_ASTNode)._vptr_ASTNode[1])();
      }
    } while (op != EXIT);
    *(undefined8 *)&(this->features_)._M_t._M_impl = uVar2;
LAB_001267a1:
    if (local_a0 != (undefined1  [8])0x0) {
      (*((ASTNode *)&((ASTNode *)local_a0)->_vptr_ASTNode)->_vptr_ASTNode[1])();
    }
  }
LAB_001267b1:
  if ((_Any_data *)local_68._M_head_impl != &local_58) {
    operator_delete(local_68._M_head_impl,(ulong)(local_58._M_unused._M_member_pointer + 1));
  }
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::powExpr() {
  // powExpr ::= negExpr ('**' powExpr)*
  SourceLocation sloc(location());
  std::unique_ptr<Expr> lhs = negExpr();
  if (!lhs) return nullptr;

  while (token() == Token::Pow) {
    nextToken();

    std::unique_ptr<Expr> rhs = powExpr();
    if (!rhs) return nullptr;

    auto opc = makeOperator(Token::Pow, lhs.get(), rhs.get());
    if (opc == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Incompatible binary expression operands ({} {} {}).",
          lhs->getType(), Token::Pow, rhs->getType());
      return nullptr;
    }

    lhs = std::make_unique<BinaryExpr>(opc, std::move(lhs), std::move(rhs));
  }

  return lhs;
}